

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O2

Instr * __thiscall GlobOpt::EnsureDisableImplicitCallRegion(GlobOpt *this,Loop *loop)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  Instr *this_00;
  Func *func;
  undefined4 extraout_var;
  MemRefOpnd *dstOpnd;
  IntConstOpnd *src1Opnd;
  IntConstOpnd *src1Opnd_00;
  Opnd *dstOpnd_00;
  IntConstOpnd *src1Opnd_01;
  Instr *pIVar5;
  BailOutInstrTemplate<IR::Instr> *this_01;
  
  if (loop->bailOutInfo == (BailOutInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                       ,0x29c,"(loop->bailOutInfo != nullptr)","loop->bailOutInfo != nullptr");
    if (!bVar2) goto LAB_0046b806;
    *puVar4 = 0;
  }
  pIVar5 = loop->endDisableImplicitCall;
  if (pIVar5 == (Instr *)0x0) {
    this_00 = EnsureBailTarget(this,loop);
    func = Loop::GetFunc(loop);
    if (loop->bailOutInfo->bailOutFunc != func) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                         ,0x2a6,"(loop->bailOutInfo->bailOutFunc == bailOutFunc)",
                         "loop->bailOutInfo->bailOutFunc == bailOutFunc");
      if (!bVar2) {
LAB_0046b806:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    iVar3 = (*this->func->m_threadContextInfo->_vptr_ThreadContextInfo[4])();
    dstOpnd = IR::MemRefOpnd::New(CONCAT44(extraout_var,iVar3),TyInt8,func,AddrOpndKindDynamicMisc);
    src1Opnd = IR::IntConstOpnd::New(3,TyInt8,func,true);
    src1Opnd_00 = IR::IntConstOpnd::New(0,TyInt8,func,true);
    dstOpnd_00 = Lowerer::GetImplicitCallFlagsOpnd(func);
    src1Opnd_01 = IR::IntConstOpnd::New(1,TyInt8,func,true);
    pIVar5 = IR::Instr::New(Ld_A,dstOpnd_00,&src1Opnd_01->super_Opnd,func);
    IR::Instr::InsertBefore(this_00,pIVar5);
    pIVar5 = IR::Instr::New(Ld_A,&dstOpnd->super_Opnd,&src1Opnd->super_Opnd,func);
    IR::Instr::InsertBefore(this_00,pIVar5);
    pIVar5 = IR::Instr::New(Ld_A,&dstOpnd->super_Opnd,&src1Opnd_00->super_Opnd,func);
    IR::Instr::InsertBefore(this_00,pIVar5);
    this_01 = IR::BailOutInstrTemplate<IR::Instr>::New
                        (BailOnNotEqual,BailOutOnImplicitCalls,loop->bailOutInfo,
                         loop->bailOutInfo->bailOutFunc);
    IR::Instr::SetSrc1(&this_01->super_Instr,dstOpnd_00);
    IR::Instr::SetSrc2(&this_01->super_Instr,&src1Opnd_01->super_Opnd);
    IR::Instr::InsertBefore(this_00,&this_01->super_Instr);
    loop->endDisableImplicitCall = pIVar5;
  }
  return pIVar5;
}

Assistant:

IR::Instr *
GlobOpt::EnsureDisableImplicitCallRegion(Loop * loop)
{
    Assert(loop->bailOutInfo != nullptr);
    IR::Instr * endDisableImplicitCall = loop->endDisableImplicitCall;
    if (endDisableImplicitCall)
    {
        return endDisableImplicitCall;
    }

    IR::Instr * bailOutTarget = EnsureBailTarget(loop);

    Func * bailOutFunc = loop->GetFunc();
    Assert(loop->bailOutInfo->bailOutFunc == bailOutFunc);

    IR::MemRefOpnd * disableImplicitCallAddress = IR::MemRefOpnd::New(this->func->GetThreadContextInfo()->GetDisableImplicitFlagsAddr(), TyInt8, bailOutFunc);
    IR::IntConstOpnd * disableImplicitCallAndExceptionValue = IR::IntConstOpnd::New(DisableImplicitCallAndExceptionFlag, TyInt8, bailOutFunc, true);
    IR::IntConstOpnd * enableImplicitCallAndExceptionValue = IR::IntConstOpnd::New(DisableImplicitNoFlag, TyInt8, bailOutFunc, true);

    IR::Opnd * implicitCallFlags = Lowerer::GetImplicitCallFlagsOpnd(bailOutFunc);
    IR::IntConstOpnd * noImplicitCall = IR::IntConstOpnd::New(Js::ImplicitCall_None, TyInt8, bailOutFunc, true);

    // Consider: if we are already doing implicit call in the outer loop, we don't need to clear the implicit call bit again
    IR::Instr * clearImplicitCall = IR::Instr::New(Js::OpCode::Ld_A, implicitCallFlags, noImplicitCall, bailOutFunc);
    bailOutTarget->InsertBefore(clearImplicitCall);

    IR::Instr * disableImplicitCall = IR::Instr::New(Js::OpCode::Ld_A, disableImplicitCallAddress, disableImplicitCallAndExceptionValue, bailOutFunc);
    bailOutTarget->InsertBefore(disableImplicitCall);

    endDisableImplicitCall = IR::Instr::New(Js::OpCode::Ld_A, disableImplicitCallAddress, enableImplicitCallAndExceptionValue, bailOutFunc);
    bailOutTarget->InsertBefore(endDisableImplicitCall);

    IR::BailOutInstr * bailOutInstr = IR::BailOutInstr::New(Js::OpCode::BailOnNotEqual, IR::BailOutOnImplicitCalls, loop->bailOutInfo, loop->bailOutInfo->bailOutFunc);
    bailOutInstr->SetSrc1(implicitCallFlags);
    bailOutInstr->SetSrc2(noImplicitCall);
    bailOutTarget->InsertBefore(bailOutInstr);

    loop->endDisableImplicitCall = endDisableImplicitCall;
    return endDisableImplicitCall;
}